

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall
leveldb::VersionSet::GetRange
          (VersionSet *this,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs,
          InternalKey *smallest,InternalKey *largest)

{
  InternalKey *__str;
  FileMetaData *pFVar1;
  size_type sVar2;
  size_type sVar3;
  int iVar4;
  pointer ppFVar5;
  InternalKeyComparator *pIVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  pointer local_58;
  size_type local_50;
  pointer local_48;
  size_type local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("!inputs.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x4a0,
                  "void leveldb::VersionSet::GetRange(const std::vector<FileMetaData *> &, InternalKey *, InternalKey *)"
                 );
  }
  (smallest->rep_)._M_string_length = 0;
  *(smallest->rep_)._M_dataplus._M_p = '\0';
  (largest->rep_)._M_string_length = 0;
  *(largest->rep_)._M_dataplus._M_p = '\0';
  ppFVar5 = (inputs->
            super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((inputs->super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar5) {
    pIVar6 = &this->icmp_;
    uVar7 = 0;
    do {
      pFVar1 = ppFVar5[uVar7];
      __str = &pFVar1->smallest;
      if (uVar7 == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&smallest->rep_,&__str->rep_);
LAB_00cfd94e:
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&largest->rep_,&(pFVar1->largest).rep_);
      }
      else {
        sVar2 = (pFVar1->smallest).rep_._M_string_length;
        if (sVar2 == 0) {
LAB_00cfd997:
          __assert_fail("!rep_.empty()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                        ,0x96,"Slice leveldb::InternalKey::Encode() const");
        }
        local_48 = (__str->rep_)._M_dataplus._M_p;
        sVar3 = (smallest->rep_)._M_string_length;
        local_40 = sVar2;
        if (sVar3 == 0) goto LAB_00cfd997;
        local_58 = (smallest->rep_)._M_dataplus._M_p;
        local_50 = sVar3;
        iVar4 = (*(pIVar6->super_Comparator)._vptr_Comparator[2])(pIVar6,&local_48,&local_58);
        if (iVar4 < 0) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (&smallest->rep_,&__str->rep_);
        }
        sVar2 = (pFVar1->largest).rep_._M_string_length;
        if (sVar2 == 0) goto LAB_00cfd997;
        local_48 = (pFVar1->largest).rep_._M_dataplus._M_p;
        sVar3 = (largest->rep_)._M_string_length;
        local_40 = sVar2;
        if (sVar3 == 0) goto LAB_00cfd997;
        local_58 = (largest->rep_)._M_dataplus._M_p;
        local_50 = sVar3;
        iVar4 = (*(pIVar6->super_Comparator)._vptr_Comparator[2])(pIVar6,&local_48,&local_58);
        if (0 < iVar4) goto LAB_00cfd94e;
      }
      uVar7 = uVar7 + 1;
      ppFVar5 = (inputs->
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar7 < (ulong)((long)(inputs->
                                   super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3)
            );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VersionSet::GetRange(const std::vector<FileMetaData*>& inputs,
                          InternalKey* smallest, InternalKey* largest) {
  assert(!inputs.empty());
  smallest->Clear();
  largest->Clear();
  for (size_t i = 0; i < inputs.size(); i++) {
    FileMetaData* f = inputs[i];
    if (i == 0) {
      *smallest = f->smallest;
      *largest = f->largest;
    } else {
      if (icmp_.Compare(f->smallest, *smallest) < 0) {
        *smallest = f->smallest;
      }
      if (icmp_.Compare(f->largest, *largest) > 0) {
        *largest = f->largest;
      }
    }
  }
}